

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O3

OPJ_BOOL opj_jp2_write_jp2c(opj_jp2_t *jp2,opj_stream_private_t *cio,opj_event_mgr_t *p_manager)

{
  OPJ_BOOL OVar1;
  OPJ_OFF_T p_size;
  OPJ_SIZE_T OVar2;
  OPJ_BYTE l_data_header [8];
  OPJ_BYTE local_30 [4];
  OPJ_BYTE local_2c [4];
  
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0x723,
                  "OPJ_BOOL opj_jp2_write_jp2c(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (cio == (opj_stream_private_t *)0x0) {
    __assert_fail("cio != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0x724,
                  "OPJ_BOOL opj_jp2_write_jp2c(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0x725,
                  "OPJ_BOOL opj_jp2_write_jp2c(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  OVar1 = opj_stream_has_seek(cio);
  if (OVar1 != 0) {
    p_size = opj_stream_tell(cio);
    opj_write_bytes_LE(local_30,(int)p_size - (int)jp2->j2k_codestream_offset,4);
    opj_write_bytes_LE(local_2c,0x6a703263,4);
    OVar1 = opj_stream_seek(cio,jp2->j2k_codestream_offset,p_manager);
    if (((OVar1 != 0) && (OVar2 = opj_stream_write_data(cio,local_30,8,p_manager), OVar2 == 8)) &&
       (OVar1 = opj_stream_seek(cio,p_size,p_manager), OVar1 != 0)) {
      return 1;
    }
    opj_event_msg(p_manager,1,"Failed to seek in the stream.\n");
    return 0;
  }
  __assert_fail("opj_stream_has_seek(cio)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                ,0x726,
                "OPJ_BOOL opj_jp2_write_jp2c(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_jp2_write_jp2c(opj_jp2_t *jp2,
                                   opj_stream_private_t *cio,
                                   opj_event_mgr_t * p_manager)
{
    OPJ_OFF_T j2k_codestream_exit;
    OPJ_BYTE l_data_header [8];

    /* preconditions */
    assert(jp2 != 00);
    assert(cio != 00);
    assert(p_manager != 00);
    assert(opj_stream_has_seek(cio));

    j2k_codestream_exit = opj_stream_tell(cio);
    opj_write_bytes(l_data_header,
                    (OPJ_UINT32)(j2k_codestream_exit - jp2->j2k_codestream_offset),
                    4); /* size of codestream */
    opj_write_bytes(l_data_header + 4, JP2_JP2C,
                    4);                                     /* JP2C */

    if (! opj_stream_seek(cio, jp2->j2k_codestream_offset, p_manager)) {
        opj_event_msg(p_manager, EVT_ERROR, "Failed to seek in the stream.\n");
        return OPJ_FALSE;
    }

    if (opj_stream_write_data(cio, l_data_header, 8, p_manager) != 8) {
        opj_event_msg(p_manager, EVT_ERROR, "Failed to seek in the stream.\n");
        return OPJ_FALSE;
    }

    if (! opj_stream_seek(cio, j2k_codestream_exit, p_manager)) {
        opj_event_msg(p_manager, EVT_ERROR, "Failed to seek in the stream.\n");
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}